

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopLevelASBase.hpp
# Opt level: O1

void __thiscall
Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::ClearInstanceData
          (TopLevelASBase<Diligent::EngineVkImplTraits> *this)

{
  IMemoryAllocator *pIVar1;
  
  std::
  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->m_Instances)._M_h);
  if (((this->m_StringPool).m_pBuffer != (Char *)0x0) &&
     (pIVar1 = (this->m_StringPool).m_pAllocator, pIVar1 != (IMemoryAllocator *)0x0)) {
    (*pIVar1->_vptr_IMemoryAllocator[1])();
  }
  (this->m_StringPool).m_ReservedSize = 0;
  (this->m_StringPool).m_pAllocator = (IMemoryAllocator *)0x0;
  (this->m_StringPool).m_pBuffer = (Char *)0x0;
  (this->m_StringPool).m_pCurrPtr = (Char *)0x0;
  (this->m_BuildInfo).BindingMode = HIT_GROUP_BINDING_MODE_LAST;
  (this->m_BuildInfo).HitGroupStride = 0;
  (this->m_BuildInfo).FirstContributionToHitGroupIndex = 0xffffffff;
  (this->m_BuildInfo).LastContributionToHitGroupIndex = 0xffffffff;
  return;
}

Assistant:

void ClearInstanceData()
    {
        this->m_Instances.clear();
        this->m_StringPool.Clear();

        this->m_BuildInfo.BindingMode                      = HIT_GROUP_BINDING_MODE_LAST;
        this->m_BuildInfo.HitGroupStride                   = 0;
        this->m_BuildInfo.FirstContributionToHitGroupIndex = INVALID_INDEX;
        this->m_BuildInfo.LastContributionToHitGroupIndex  = INVALID_INDEX;
    }